

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_meta.c
# Opt level: O2

cTValue * lj_meta_tget(lua_State *L,cTValue *o,cTValue *k)

{
  uint uVar1;
  cTValue *o_00;
  cTValue *pcVar2;
  TValue *pTVar3;
  uint32_t uVar4;
  int iVar5;
  GCtab *mt;
  
  iVar5 = 0x65;
  do {
    o_00 = o;
    iVar5 = iVar5 + -1;
    if (iVar5 == 0) {
      lj_err_msg(L,LJ_ERR_GETLOOP);
    }
    if ((o_00->field_2).it == 0xfffffff4) {
      uVar1 = (o_00->u32).lo;
      pcVar2 = lj_tab_get(L,(GCtab *)(ulong)uVar1,k);
      if ((pcVar2->field_2).it != 0xffffffff) {
        return pcVar2;
      }
      mt = (GCtab *)(ulong)(((GCtab *)(ulong)uVar1)->metatable).gcptr32;
      if (mt == (GCtab *)0x0) {
        return pcVar2;
      }
      if ((mt->nomm & 1) != 0) {
        return pcVar2;
      }
      o = lj_meta_cache(mt,MM_index,(GCstr *)(ulong)*(uint *)((ulong)(L->glref).ptr32 + 0x100));
      if (o == (cTValue *)0x0) {
        return pcVar2;
      }
      uVar4 = (o->field_2).it;
    }
    else {
      o = lj_meta_lookup(L,o_00,MM_index);
      uVar4 = (o->field_2).it;
      if (uVar4 == 0xffffffff) {
        lj_err_optype(L,o_00,LJ_ERR_OPINDEX);
      }
    }
    if (uVar4 == 0xfffffff7) {
      pTVar3 = mmcall(L,lj_cont_ra,o,o_00,k);
      L->top = pTVar3;
      return (cTValue *)0x0;
    }
  } while( true );
}

Assistant:

cTValue *lj_meta_tget(lua_State *L, cTValue *o, cTValue *k)
{
  int loop;
  for (loop = 0; loop < LJ_MAX_IDXCHAIN; loop++) {
    cTValue *mo;
    if (LJ_LIKELY(tvistab(o))) {
      GCtab *t = tabV(o);
      cTValue *tv = lj_tab_get(L, t, k);
      if (!tvisnil(tv) ||
	  !(mo = lj_meta_fast(L, tabref(t->metatable), MM_index)))
	return tv;
    } else if (tvisnil(mo = lj_meta_lookup(L, o, MM_index))) {
      lj_err_optype(L, o, LJ_ERR_OPINDEX);
      return NULL;  /* unreachable */
    }
    if (tvisfunc(mo)) {
      L->top = mmcall(L, lj_cont_ra, mo, o, k);
      return NULL;  /* Trigger metamethod call. */
    }
    o = mo;
  }
  lj_err_msg(L, LJ_ERR_GETLOOP);
  return NULL;  /* unreachable */
}